

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zarray.h
# Opt level: O2

void zarray_destroy(zarray_t *za)

{
  if (za != (zarray_t *)0x0) {
    free(za->data);
    free(za);
    return;
  }
  return;
}

Assistant:

static inline void zarray_destroy(zarray_t *za)
{
    if (za == NULL)
        return;

    if (za->data != NULL)
        free(za->data);
    memset(za, 0, sizeof(zarray_t));
    free(za);
}